

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaCom.c
# Opt level: O3

int Cba_CommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Cba_Man_t *p;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uint fInlineConcat;
  
  p = (Cba_Man_t *)pAbc->pAbcCba;
  fInlineConcat = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"cvh"), iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 != 99) {
      Abc_Print(-2,"usage: @write [-cvh]\n");
      Abc_Print(-2,"\t         writes the design into a file in BLIF or Verilog\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fInlineConcat == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle inlining input concatenations [default = %s]\n",pcVar3);
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
    fInlineConcat = fInlineConcat ^ 1;
  }
  if (p == (Cba_Man_t *)0x0) {
    Abc_Print(1,"Cba_CommandWrite(): There is no current design.\n");
    return 0;
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar3 = argv[globalUtilOptind];
  }
  else {
    if (globalUtilOptind != argc) {
      pcVar3 = "Output file name should be given on the command line.";
      goto LAB_0032e92c;
    }
    pcVar3 = p->pSpec;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = p->pName;
    }
    pcVar3 = Extra_FileNameGenericAppend(pcVar3,"_out.v");
    printf("Generated output file name \"%s\".\n",pcVar3);
  }
  pcVar4 = Extra_FileNameExtension(pcVar3);
  iVar2 = strcmp(pcVar4,"blif");
  if (iVar2 == 0) {
    Cba_ManWriteBlif(pcVar3,p);
    return 0;
  }
  pcVar4 = Extra_FileNameExtension(pcVar3);
  if ((*pcVar4 == 'v') && (pcVar4[1] == '\0')) {
    Cba_ManWriteVerilog(pcVar3,p,fInlineConcat);
    return 0;
  }
  pcVar4 = Extra_FileNameExtension(pcVar3);
  iVar2 = strcmp(pcVar4,"cba");
  if (iVar2 == 0) {
    Cba_ManWriteCba(pcVar3,p);
    return 0;
  }
  pcVar3 = "Unrecognized output file extension.";
LAB_0032e92c:
  puts(pcVar3);
  return 0;
}

Assistant:

int Cba_CommandWrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cba_Man_t * p = Cba_AbcGetMan(pAbc);
    char * pFileName = NULL;
    int fInclineCats =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fInclineCats ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Cba_CommandWrite(): There is no current design.\n" );
        return 0;
    }

    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && p )
    {
        pFileName = Extra_FileNameGenericAppend( Cba_ManSpec(p) ? Cba_ManSpec(p) : Cba_ManName(p), "_out.v" );
        printf( "Generated output file name \"%s\".\n", pFileName );
    }
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
        Cba_ManWriteBlif( pFileName, p );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
        Cba_ManWriteVerilog( pFileName, p, fInclineCats );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "cba" )  )
        Cba_ManWriteCba( pFileName, p );
    else 
    {
        printf( "Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;
usage:
    Abc_Print( -2, "usage: @write [-cvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-c     : toggle inlining input concatenations [default = %s]\n",  fInclineCats? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}